

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem2der.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *q;
  char *p;
  size_t sStack_1438;
  int i;
  size_t der_size;
  size_t pem_size;
  char buf [1024];
  uchar der_buffer [4096];
  uchar *pem_buffer;
  int exit_code;
  int ret;
  char **argv_local;
  int argc_local;
  
  pem_buffer._0_4_ = 1;
  der_buffer[0xff8] = '\0';
  der_buffer[0xff9] = '\0';
  der_buffer[0xffa] = '\0';
  der_buffer[0xffb] = '\0';
  der_buffer[0xffc] = '\0';
  der_buffer[0xffd] = '\0';
  der_buffer[0xffe] = '\0';
  der_buffer[0xfff] = '\0';
  sStack_1438 = 0x1000;
  memset(&pem_size,0,0x400);
  memset(buf + 0x3f8,0,0x1000);
  if (argc == 0) {
LAB_00101488:
    printf(
          "\n usage: pem2der param=<>...\n\n acceptable parameters:\n    filename=%%s         default: file.pem\n    output_file=%%s      default: file.der\n\n"
          );
  }
  else {
    opt.filename = "file.pem";
    opt.output_file = "file.der";
    for (p._4_4_ = 1; p._4_4_ < argc; p._4_4_ = p._4_4_ + 1) {
      __s = argv[p._4_4_];
      pcVar5 = strchr(__s,0x3d);
      if (pcVar5 == (char *)0x0) goto LAB_00101488;
      *pcVar5 = '\0';
      iVar3 = strcmp(__s,"filename");
      pcVar1 = pcVar5 + 1;
      pcVar2 = opt.output_file;
      if ((iVar3 != 0) &&
         (iVar3 = strcmp(__s,"output_file"), pcVar1 = opt.filename, pcVar2 = pcVar5 + 1, iVar3 != 0)
         ) goto LAB_00101488;
      opt.output_file = pcVar2;
      opt.filename = pcVar1;
    }
    printf("\n  . Loading the PEM file ...");
    fflush(_stdout);
    uVar4 = load_file(opt.filename,(uchar **)(der_buffer + 0xff8),&der_size);
    if (uVar4 == 0) {
      printf(" ok\n");
      printf("  . Converting from PEM to DER ...");
      fflush(_stdout);
      uVar4 = convert_pem_to_der((uchar *)der_buffer._4088_8_,der_size,(uchar *)(buf + 0x3f8),
                                 &stack0xffffffffffffebc8);
      if (uVar4 == 0) {
        printf(" ok\n");
        printf("  . Writing the DER file ...");
        fflush(_stdout);
        uVar4 = write_file(opt.output_file,(uchar *)(buf + 0x3f8),sStack_1438);
        if (uVar4 == 0) {
          printf(" ok\n");
          pem_buffer._0_4_ = 0;
        }
        else {
          mbedtls_strerror(uVar4,(char *)&pem_size,0x400);
          printf(" failed\n  !  write_file returned %d - %s\n\n",(ulong)uVar4,&pem_size);
        }
      }
      else {
        mbedtls_strerror(uVar4,(char *)&pem_size,0x400);
        printf(" failed\n  !  convert_pem_to_der %d - %s\n\n",(ulong)uVar4,&pem_size);
      }
    }
    else {
      mbedtls_strerror(uVar4,(char *)&pem_size,0x400);
      printf(" failed\n  !  load_file returned %d - %s\n\n",(ulong)uVar4,&pem_size);
    }
  }
  free((void *)der_buffer._4088_8_);
  return (int)pem_buffer;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    unsigned char *pem_buffer = NULL;
    unsigned char der_buffer[4096];
    char buf[1024];
    size_t pem_size, der_size = sizeof(der_buffer);
    int i;
    char *p, *q;

    /*
     * Set to sane values
     */
    memset( buf, 0, sizeof(buf) );
    memset( der_buffer, 0, sizeof(der_buffer) );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto exit;
    }

    opt.filename            = DFL_FILENAME;
    opt.output_file         = DFL_OUTPUT_FILENAME;

    for( i = 1; i < argc; i++ )
    {

        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "output_file" ) == 0 )
            opt.output_file = q;
        else
            goto usage;
    }

    /*
     * 1.1. Load the PEM file
     */
    mbedtls_printf( "\n  . Loading the PEM file ..." );
    fflush( stdout );

    ret = load_file( opt.filename, &pem_buffer, &pem_size );

    if( ret != 0 )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, 1024 );
#endif
        mbedtls_printf( " failed\n  !  load_file returned %d - %s\n\n", ret, buf );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1.2. Convert from PEM to DER
     */
    mbedtls_printf( "  . Converting from PEM to DER ..." );
    fflush( stdout );

    if( ( ret = convert_pem_to_der( pem_buffer, pem_size, der_buffer, &der_size ) ) != 0 )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, 1024 );
#endif
        mbedtls_printf( " failed\n  !  convert_pem_to_der %d - %s\n\n", ret, buf );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1.3. Write the DER file
     */
    mbedtls_printf( "  . Writing the DER file ..." );
    fflush( stdout );

    ret = write_file( opt.output_file, der_buffer, der_size );

    if( ret != 0 )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, 1024 );
#endif
        mbedtls_printf( " failed\n  !  write_file returned %d - %s\n\n", ret, buf );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    free( pem_buffer );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}